

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_client_read(Curl_easy *data,char *buf,size_t blen,size_t *nread,_Bool *eos)

{
  CURLcode result;
  _Bool *eos_local;
  size_t *nread_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  if ((((((data->req).reader_stack != (Curl_creader *)0x0) ||
        (data_local._4_4_ = Curl_creader_set_fread(data,(data->state).infilesize),
        data_local._4_4_ == CURLE_OK)) &&
       (data_local._4_4_ = Curl_creader_read(data,(data->req).reader_stack,buf,blen,nread,eos),
       data != (Curl_easy *)0x0)) &&
      (((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0 &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"client_read(len=%zu) -> %d, nread=%zu, eos=%d",blen,(ulong)data_local._4_4_,
                  *nread,(ulong)(*eos & 1));
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_client_read(struct Curl_easy *data, char *buf, size_t blen,
                          size_t *nread, bool *eos)
{
  CURLcode result;

  DEBUGASSERT(buf);
  DEBUGASSERT(blen);
  DEBUGASSERT(nread);
  DEBUGASSERT(eos);

  if(!data->req.reader_stack) {
    result = Curl_creader_set_fread(data, data->state.infilesize);
    if(result)
      return result;
    DEBUGASSERT(data->req.reader_stack);
  }

  result = Curl_creader_read(data, data->req.reader_stack, buf, blen,
                             nread, eos);
  CURL_TRC_READ(data, "client_read(len=%zu) -> %d, nread=%zu, eos=%d",
                blen, result, *nread, *eos);
  return result;
}